

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O0

vector<ReadCacheItem,_std::allocator<ReadCacheItem>_> * __thiscall
LongReadsMapper::create_read_paths
          (LongReadsMapper *this,vector<long,_std::allocator<long>_> *backbone,
          vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
          *filtered_read_mappings,ReadPathParams *read_path_params)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference pvVar5;
  undefined4 extraout_var;
  char *pcVar6;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *this_00;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *pvVar7;
  reference pvVar8;
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  *in_RCX;
  vector<long,_std::allocator<long>_> *in_RDX;
  long in_RSI;
  vector<ReadCacheItem,_std::allocator<ReadCacheItem>_> *in_RDI;
  vector<long,_std::allocator<long>_> *in_R8;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar9;
  uint32_t rcp;
  string seq;
  iterator find_it;
  unsigned_long *read;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  uint32_t bn;
  ReadSequenceBuffer sequenceGetter;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  useful_read;
  vector<ReadCacheItem,_std::allocator<ReadCacheItem>_> *read_cache;
  string *in_stack_00000888;
  undefined1 in_stack_00000897;
  ReadPathParams *in_stack_00000898;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *in_stack_000008a0;
  LongReadsMapper *in_stack_000008a8;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_fffffffffffffe28;
  ReadSequenceBuffer *in_stack_fffffffffffffe30;
  LongReadsDatastore *in_stack_fffffffffffffe38;
  vector<long,_std::allocator<long>_> *__x;
  ReadSequenceBuffer *in_stack_fffffffffffffe40;
  allocator *in_stack_fffffffffffffe50;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *in_stack_fffffffffffffe78;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *in_stack_fffffffffffffe80;
  uint local_120;
  allocator local_119;
  string local_118 [32];
  undefined7 in_stack_ffffffffffffff11;
  _Node_iterator_base<unsigned_long,_false> local_e8;
  _Node_iterator_base<unsigned_long,_false> local_e0;
  reference local_d8;
  unsigned_long *local_d0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_c8;
  reference local_c0;
  uint local_b8;
  byte local_61;
  vector<long,_std::allocator<long>_> *local_28;
  vector<long,_std::allocator<long>_> *local_18;
  
  local_28 = in_R8;
  local_18 = in_RDX;
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)0x3f83fe);
  local_61 = 0;
  std::vector<ReadCacheItem,_std::allocator<ReadCacheItem>_>::vector
            ((vector<ReadCacheItem,_std::allocator<ReadCacheItem>_> *)0x3f8410);
  ReadSequenceBuffer::ReadSequenceBuffer
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,(size_t)in_stack_fffffffffffffe30,
             (size_t)in_stack_fffffffffffffe28);
  for (local_b8 = 0; uVar3 = (ulong)local_b8,
      sVar4 = std::vector<long,_std::allocator<long>_>::size(local_18), uVar3 < sVar4;
      local_b8 = local_b8 + 1) {
    in_stack_fffffffffffffe78 =
         (vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)(in_RSI + 0xb0);
    pvVar5 = std::vector<long,_std::allocator<long>_>::operator[](local_18,(ulong)local_b8);
    iVar2 = std::abs((int)*pvVar5);
    in_stack_fffffffffffffe80 =
         (vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)CONCAT44(extraout_var,iVar2);
    local_c0 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             *)in_stack_fffffffffffffe78,(size_type)in_stack_fffffffffffffe80);
    local_c8._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_fffffffffffffe28);
    local_d0 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffe28);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffffe30,
                              (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffffe28), bVar1) {
      local_d8 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_c8);
      local_e0._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::find(in_stack_fffffffffffffe28,(key_type *)0x3f852b);
      local_e8._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           ::cend(in_stack_fffffffffffffe28);
      bVar1 = std::__detail::operator==(&local_e0,&local_e8);
      if (bVar1) {
        pVar9 = std::
                unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>
                ::emplace<unsigned_long_const&>
                          ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)in_stack_fffffffffffffe40,(unsigned_long *)in_stack_fffffffffffffe38);
        pcVar6 = ReadSequenceBuffer::get_read_sequence
                           ((ReadSequenceBuffer *)CONCAT71(in_stack_ffffffffffffff11,pVar9.second),
                            (uint64_t)
                            pVar9.first.super__Node_iterator_base<unsigned_long,_false>._M_cur.
                            super__Node_iterator_base<unsigned_long,_false>);
        in_stack_fffffffffffffe50 = &local_119;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_118,pcVar6,in_stack_fffffffffffffe50);
        std::allocator<char>::~allocator((allocator<char> *)&local_119);
        std::vector<ReadCacheItem,std::allocator<ReadCacheItem>>::
        emplace_back<unsigned_long_const&,std::__cxx11::string&>
                  ((vector<ReadCacheItem,_std::allocator<ReadCacheItem>_> *)
                   in_stack_fffffffffffffe40,(unsigned_long *)in_stack_fffffffffffffe38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe30);
        std::__cxx11::string::~string(local_118);
      }
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_c8);
    }
  }
  sVar4 = in_RSI + 0x98;
  std::
  vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
  ::size(in_RCX);
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::resize((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            *)in_stack_fffffffffffffe50,sVar4);
  local_120 = 0;
  while( true ) {
    this_00 = (vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)(ulong)local_120;
    pvVar7 = (vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)
             std::vector<ReadCacheItem,_std::allocator<ReadCacheItem>_>::size(in_RDI);
    if (pvVar7 <= this_00) break;
    pvVar8 = std::vector<ReadCacheItem,_std::allocator<ReadCacheItem>_>::operator[]
                       (in_RDI,(ulong)local_120);
    std::
    vector<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>,_std::allocator<std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>_>
    ::operator[](in_RCX,pvVar8->id);
    std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::vector
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    __x = local_28;
    std::vector<ReadCacheItem,_std::allocator<ReadCacheItem>_>::operator[](in_RDI,(ulong)local_120);
    create_read_path(in_stack_000008a8,in_stack_000008a0,in_stack_00000898,(bool)in_stack_00000897,
                     in_stack_00000888);
    in_stack_fffffffffffffe30 = (ReadSequenceBuffer *)(in_RSI + 0x98);
    pvVar8 = std::vector<ReadCacheItem,_std::allocator<ReadCacheItem>_>::operator[]
                       (in_RDI,(ulong)local_120);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  *)in_stack_fffffffffffffe30,pvVar8->id);
    std::vector<long,_std::allocator<long>_>::operator=
              ((vector<long,_std::allocator<long>_> *)this_00,__x);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)this_00);
    std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::~vector(this_00);
    local_120 = local_120 + 1;
  }
  local_61 = 1;
  ReadSequenceBuffer::~ReadSequenceBuffer(in_stack_fffffffffffffe30);
  if ((local_61 & 1) == 0) {
    std::vector<ReadCacheItem,_std::allocator<ReadCacheItem>_>::~vector
              ((vector<ReadCacheItem,_std::allocator<ReadCacheItem>_> *)this_00);
  }
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)0x3f8891);
  return in_RDI;
}

Assistant:

std::vector<ReadCacheItem> LongReadsMapper::create_read_paths(const std::vector<sgNodeID_t> &backbone, const std::vector<std::vector<LongReadMapping>> filtered_read_mappings, const ReadPathParams &read_path_params) {
    std::unordered_set<uint64_t> useful_read;
    std::vector<ReadCacheItem> read_cache;
    ReadSequenceBuffer sequenceGetter(datastore);
    for (uint32_t bn = 0; bn < backbone.size(); bn++) {
        for (const auto &read:reads_in_node[std::abs(backbone[bn])]) {
            const auto find_it = useful_read.find(read);
            if (find_it == useful_read.cend()) {
                useful_read.emplace(read);
                std::string seq = sequenceGetter.get_read_sequence(read);
                read_cache.emplace_back(read, seq);
            }

        }
    }
    
    // TODO: HACK! Move this to somewhere it makes more sense
    read_paths.resize(filtered_read_mappings.size());
    
#pragma omp parallel for
    for (uint32_t rcp = 0; rcp < read_cache.size(); rcp++) {
        read_paths[read_cache[rcp].id] = create_read_path(filtered_read_mappings[read_cache[rcp].id], read_path_params, false, read_cache[rcp].seq);
    }

    return read_cache;
}